

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

UBool findCommonICUDataByName(char *inBasename,UErrorCode *err)

{
  UBool UVar1;
  Mutex local_38;
  Mutex lock;
  UDataMemory *pData;
  int32_t i;
  UBool found;
  UErrorCode *err_local;
  char *inBasename_local;
  
  pData._7_1_ = '\0';
  lock.fMutex = (UMutex *)udata_findCachedData(inBasename,err);
  UVar1 = U_FAILURE(*err);
  if ((UVar1 == '\0') && (lock.fMutex != (UMutex *)0x0)) {
    icu_63::Mutex::Mutex(&local_38,(UMutex *)0x0);
    for (pData._0_4_ = 0; (int)pData < 10; pData._0_4_ = (int)pData + 1) {
      if ((gCommonICUDataArray[(int)pData] != (UDataMemory *)0x0) &&
         (gCommonICUDataArray[(int)pData]->pHeader ==
          *(DataHeader **)((long)&(lock.fMutex)->fMutex + 8))) {
        pData._7_1_ = '\x01';
        break;
      }
    }
    icu_63::Mutex::~Mutex(&local_38);
    inBasename_local._7_1_ = pData._7_1_;
  }
  else {
    inBasename_local._7_1_ = '\0';
  }
  return inBasename_local._7_1_;
}

Assistant:

static UBool U_CALLCONV
findCommonICUDataByName(const char *inBasename, UErrorCode &err)
{
    UBool found = FALSE;
    int32_t i;

    UDataMemory  *pData = udata_findCachedData(inBasename, err);
    if (U_FAILURE(err) || pData == NULL)
        return FALSE;

    {
        Mutex lock;
        for (i = 0; i < UPRV_LENGTHOF(gCommonICUDataArray); ++i) {
            if ((gCommonICUDataArray[i] != NULL) && (gCommonICUDataArray[i]->pHeader == pData->pHeader)) {
                /* The data pointer is already in the array. */
                found = TRUE;
                break;
            }
        }
    }
    return found;
}